

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::con_<128l,1l,1l,1,1,0,0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,true,void>>
          (con_<128l,1l,1l,1,1,0,0> *this,
          subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  con_<128l,1l,1l,1,1,0,0> *this_00;
  tensor_conv *this_01;
  tensor *ptVar1;
  tensor *ptVar2;
  alias_tensor_instance local_c0;
  alias_tensor_instance local_78;
  
  this_00 = this + 0x98;
  this_01 = (tensor_conv *)(this + 0x128);
  ptVar1 = sub->l->cached_output_ptr;
  ptVar2 = &(sub->l->cached_output).super_tensor;
  if (ptVar1 != (tensor *)0x0) {
    ptVar2 = ptVar1;
  }
  alias_tensor::operator()(&local_c0,(alias_tensor *)this_00,(tensor *)this,0);
  cpu::tensor_conv::setup
            (this_01,ptVar2,&local_c0.super_tensor,1,1,*(int *)(this + 0x170),*(int *)(this + 0x174)
            );
  ptVar1 = sub->l->cached_output_ptr;
  ptVar2 = &(sub->l->cached_output).super_tensor;
  if (ptVar1 != (tensor *)0x0) {
    ptVar2 = ptVar1;
  }
  if (this[0x178] == (con_<128l,1l,1l,1,1,0,0>)0x1) {
    alias_tensor::operator()(&local_c0,(alias_tensor *)this_00,(tensor *)this,0);
    alias_tensor::operator()
              (&local_78,(alias_tensor *)(this + 0xe0),(tensor *)this,*(size_t *)(this + 0xc0));
    cpu::tensor_conv::operator()
              (this_01,false,output,ptVar2,&local_c0.super_tensor,&local_78.super_tensor,
               (bool)this[0x179]);
  }
  else {
    alias_tensor::operator()(&local_c0,(alias_tensor *)this_00,(tensor *)this,0);
    cpu::tensor_conv::operator()(this_01,false,output,ptVar2,&local_c0.super_tensor);
  }
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            conv.setup(sub.get_output(),
                       filters(params,0),
                       _stride_y,
                       _stride_x,
                       padding_y_,
                       padding_x_);

            if (use_bias)
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0),
                     biases(params, filters.size()),
                     use_relu);
            }
            else
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0));
            }
        }